

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_contains.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MapContainsBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  size_type sVar2;
  undefined8 uVar3;
  bool bVar4;
  reference pvVar5;
  pointer pEVar6;
  pointer pEVar7;
  reference pvVar8;
  LogicalType *pLVar9;
  LogicalType *left;
  ParameterNotResolvedException *this_01;
  BinderException *this_02;
  LogicalType *right;
  vector<duckdb::LogicalType,_true> *pvVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  LogicalType max_child_type;
  string local_110;
  LogicalType local_f0;
  LogicalType local_d8;
  LogicalType local_c0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  if ((pEVar6->return_type).id_ == UNKNOWN) {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pLVar9 = &pEVar6->return_type;
  right = &pEVar7->return_type;
  if (right->id_ == UNKNOWN) {
    pvVar10 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
    pvVar8 = vector<duckdb::LogicalType,_true>::operator[](pvVar10,0);
    if (pvVar8 != pLVar9) {
      pvVar8->id_ = (pEVar6->return_type).id_;
      pvVar8->physical_type_ = (pEVar6->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar8->type_info_,&(pEVar6->return_type).type_info_);
    }
    pLVar9 = MapType::KeyType(pLVar9);
    pvVar8 = vector<duckdb::LogicalType,_true>::operator[](pvVar10,1);
    if (pvVar8 != pLVar9) {
      pvVar8->id_ = pLVar9->id_;
      pvVar8->physical_type_ = pLVar9->physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar8->type_info_,&pLVar9->type_info_);
    }
  }
  else {
    LogicalType::LogicalType(&local_f0);
    left = MapType::KeyType(pLVar9);
    bVar4 = LogicalType::TryGetMaxLogicalType(context,left,right,&local_f0);
    if (!bVar4) {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "%s: Cannot match element of type \'%s\' in a map of type \'%s\' - an explicit cast is required"
                 ,"");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar1 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
               _M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,
                 pcVar1 + (bound_function->super_BaseScalarFunction).super_SimpleFunction.
                          super_Function.name._M_string_length);
      LogicalType::ToString_abi_cxx11_(&local_50,right);
      LogicalType::ToString_abi_cxx11_(&local_70,pLVar9);
      BinderException::
      BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this_02,&local_110,&local_90,&local_50,&local_70);
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_c0,&local_f0);
    pLVar9 = MapType::ValueType(pLVar9);
    LogicalType::LogicalType(&local_d8,pLVar9);
    LogicalType::MAP((LogicalType *)&local_110,&local_c0,&local_d8);
    pvVar10 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
    pvVar8 = vector<duckdb::LogicalType,_true>::operator[](pvVar10,0);
    uVar3 = local_110.field_2._M_allocated_capacity;
    sVar2 = local_110._M_string_length;
    pvVar8->id_ = (LogicalTypeId)local_110._M_dataplus._M_p;
    pvVar8->physical_type_ = local_110._M_dataplus._M_p._1_1_;
    uVar11 = *(undefined4 *)
              &(pvVar8->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar12 = *(undefined4 *)
              ((long)&(pvVar8->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              4);
    uVar13 = *(undefined4 *)
              &(pvVar8->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    uVar14 = *(undefined4 *)
              ((long)&(pvVar8->type_info_).internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    (pvVar8->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pvVar8->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_110._M_string_length = 0;
    local_110.field_2._M_allocated_capacity = 0;
    this_00 = (pvVar8->type_info_).internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (pvVar8->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)sVar2;
    (pvVar8->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_a8 = uVar11;
      uStack_a4 = uVar12;
      uStack_a0 = uVar13;
      uStack_9c = uVar14;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      uVar11 = local_a8;
      uVar12 = uStack_a4;
      uVar13 = uStack_a0;
      uVar14 = uStack_9c;
    }
    uVar3 = local_110.field_2._M_allocated_capacity;
    local_110._M_string_length = CONCAT44(uVar12,uVar11);
    local_110.field_2._M_allocated_capacity._4_4_ = uVar14;
    local_110.field_2._M_allocated_capacity._0_4_ = uVar13;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
    }
    LogicalType::~LogicalType((LogicalType *)&local_110);
    LogicalType::~LogicalType(&local_d8);
    LogicalType::~LogicalType(&local_c0);
    pvVar8 = vector<duckdb::LogicalType,_true>::operator[](pvVar10,1);
    if (pvVar8 != &local_f0) {
      pvVar8->id_ = local_f0.id_;
      pvVar8->physical_type_ = local_f0.physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar8->type_info_,&local_f0.type_info_);
    }
    LogicalType::~LogicalType(&local_f0);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> MapContainsBind(ClientContext &context, ScalarFunction &bound_function,
                                                vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);

	const auto &map = arguments[0]->return_type;
	const auto &key = arguments[1]->return_type;

	if (map.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}

	if (key.id() == LogicalTypeId::UNKNOWN) {
		// Infer the argument type from the map type
		bound_function.arguments[0] = map;
		bound_function.arguments[1] = MapType::KeyType(map);
	} else {
		LogicalType max_child_type;
		if (!LogicalType::TryGetMaxLogicalType(context, MapType::KeyType(map), key, max_child_type)) {
			throw BinderException(
			    "%s: Cannot match element of type '%s' in a map of type '%s' - an explicit cast is required",
			    bound_function.name, key.ToString(), map.ToString());
		}

		bound_function.arguments[0] = LogicalType::MAP(max_child_type, MapType::ValueType(map));
		bound_function.arguments[1] = max_child_type;
	}
	return nullptr;
}